

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recovery_test.cc
# Opt level: O2

string * __thiscall
leveldb::RecoveryTest::ManifestFileName_abi_cxx11_
          (string *__return_storage_ptr__,RecoveryTest *this)

{
  Env *env;
  Status local_200;
  string current;
  string local_1d8;
  Tester local_1b8;
  
  current._M_dataplus._M_p = (pointer)&current.field_2;
  current._M_string_length = 0;
  current.field_2._M_local_buf[0] = '\0';
  test::Tester::Tester
            (&local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
             ,0x57);
  env = this->env_;
  CurrentFileName(&local_1d8,&this->dbname_);
  ReadFileToString((leveldb *)&local_200,env,&local_1d8,&current);
  test::Tester::IsOk(&local_1b8,&local_200);
  Status::~Status(&local_200);
  std::__cxx11::string::~string((string *)&local_1d8);
  test::Tester::~Tester(&local_1b8);
  if ((current._M_string_length != 0) &&
     (current._M_dataplus._M_p[current._M_string_length - 1] == '\n')) {
    std::__cxx11::string::resize((ulong)&current);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b8,
                 &this->dbname_,"/");
  std::operator+(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b8,
                 &current);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&current);
  return __return_storage_ptr__;
}

Assistant:

std::string ManifestFileName() {
    std::string current;
    ASSERT_OK(ReadFileToString(env_, CurrentFileName(dbname_), &current));
    size_t len = current.size();
    if (len > 0 && current[len - 1] == '\n') {
      current.resize(len - 1);
    }
    return dbname_ + "/" + current;
  }